

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O0

void __thiscall
QRasterPaintEngine::fillPath(QRasterPaintEngine *this,QPainterPath *path,QSpanData *fillData)

{
  long lVar1;
  int iVar2;
  QRasterPaintEnginePrivate *pQVar3;
  QRasterPaintEngineState *pQVar4;
  QRasterBuffer *rasterBuffer;
  QSpanData *in_RDX;
  QRasterPaintEnginePrivate *in_RDI;
  long in_FS_OFFSET;
  bool do_clip;
  ProcessSpans blend;
  QRasterPaintEngineState *s;
  QRasterPaintEnginePrivate *d;
  QRect deviceRect;
  QRectF controlPointRect;
  QSpanData *in_stack_ffffffffffffff30;
  QRect *in_stack_ffffffffffffff38;
  QRasterPaintEnginePrivate *in_stack_ffffffffffffff40;
  QSpanData *in_stack_ffffffffffffff50;
  uint7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  undefined1 uVar5;
  FillRule fillRule;
  undefined7 in_stack_ffffffffffffff68;
  QRectF *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDX->blend != (ProcessSpans)0x0) {
    pQVar3 = d_func((QRasterPaintEngine *)0x565f20);
    QPainterPath::controlPointRect((QPainterPath *)in_stack_ffffffffffffff40);
    pQVar4 = state((QRasterPaintEngine *)0x565f7d);
    QTransform::mapRect((QTransform *)&DAT_aaaaaaaaaaaaaaaa,in_stack_ffffffffffffffc0);
    QRectF::toRect((QRectF *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    rasterBuffer = (QRasterBuffer *)
                   QRasterPaintEnginePrivate::getBrushFunc
                             (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                              in_stack_ffffffffffffff30);
    iVar2 = QRect::left((QRect *)0x566007);
    uVar5 = true;
    if (-0x800000 < iVar2) {
      iVar2 = QRect::right((QRect *)0x566024);
      uVar5 = true;
      if (iVar2 < 0x800000) {
        iVar2 = QRect::top((QRect *)0x566041);
        uVar5 = true;
        if (-0x800000 < iVar2) {
          iVar2 = QRect::bottom((QRect *)0x56605e);
          uVar5 = 0x7fffff < iVar2;
        }
      }
    }
    if (((*(ushort *)&pQVar4->field_12 >> 3 & 1) == 0) && ((bool)uVar5 == false)) {
      QRasterPaintEnginePrivate::initializeRasterizer
                ((QRasterPaintEnginePrivate *)(ulong)in_stack_ffffffffffffff58,
                 in_stack_ffffffffffffff50);
      fillRule = (FillRule)((ulong)in_RDI >> 0x20);
      QScopedPointer<QRasterizer,_QScopedPointerDeleter<QRasterizer>_>::operator->
                (&pQVar3->rasterizer);
      ::operator*((QPainterPath *)in_stack_ffffffffffffff38,(QTransform *)in_stack_ffffffffffffff30)
      ;
      QPainterPath::fillRule((QPainterPath *)in_stack_ffffffffffffff30);
      QRasterizer::rasterize
                ((QRasterizer *)rasterBuffer,
                 (QPainterPath *)CONCAT17(uVar5,in_stack_ffffffffffffff68),fillRule);
      QPainterPath::~QPainterPath((QPainterPath *)0x5660fc);
    }
    else {
      ensureOutlineMapper((QRasterPaintEngine *)in_stack_ffffffffffffff30);
      QScopedPointer<QOutlineMapper,_QScopedPointerDeleter<QOutlineMapper>_>::operator->
                (&pQVar3->outlineMapper);
      QOutlineMapper::convertPath
                ((QOutlineMapper *)in_RDI,(QPainterPath *)CONCAT17(uVar5,in_stack_ffffffffffffff58))
      ;
      QScopedPointer<QRasterBuffer,_QScopedPointerDeleter<QRasterBuffer>_>::data
                (&pQVar3->rasterBuffer);
      QRasterPaintEnginePrivate::rasterize
                (in_RDI,(QT_FT_Outline *)CONCAT17(uVar5,in_stack_ffffffffffffff58),
                 (ProcessSpans)in_stack_ffffffffffffff50,in_RDX,rasterBuffer);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRasterPaintEngine::fillPath(const QPainterPath &path, QSpanData *fillData)
{
#ifdef QT_DEBUG_DRAW
    qDebug() << " --- fillPath, bounds=" << path.boundingRect();
#endif

    if (!fillData->blend)
        return;

    Q_D(QRasterPaintEngine);

    const QRectF controlPointRect = path.controlPointRect();

    QRasterPaintEngineState *s = state();
    const QRect deviceRect = s->matrix.mapRect(controlPointRect).toRect();
    ProcessSpans blend = d->getBrushFunc(deviceRect, fillData);
    const bool do_clip = (deviceRect.left() < -QT_RASTER_COORD_LIMIT
                          || deviceRect.right() > QT_RASTER_COORD_LIMIT
                          || deviceRect.top() < -QT_RASTER_COORD_LIMIT
                          || deviceRect.bottom() > QT_RASTER_COORD_LIMIT);

    if (!s->flags.antialiased && !do_clip) {
        d->initializeRasterizer(fillData);
        d->rasterizer->rasterize(path * s->matrix, path.fillRule());
        return;
    }

    ensureOutlineMapper();
    d->rasterize(d->outlineMapper->convertPath(path), blend, fillData, d->rasterBuffer.data());
}